

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::shaderexecutor::PackSnorm4x8Case::createInstance(PackSnorm4x8Case *this,Context *ctx)

{
  PackSnorm4x8CaseInstance *this_00;
  
  this_00 = (PackSnorm4x8CaseInstance *)operator_new(0xb0);
  PackSnorm4x8CaseInstance::PackSnorm4x8CaseInstance
            (this_00,ctx,(this->super_ShaderPackingFunctionCase).m_shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,this->m_precision,
             (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new PackSnorm4x8CaseInstance(ctx, m_shaderType, m_spec, m_precision, getName());
	}